

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void FlecsSystemImport(ecs_world_t *world)

{
  ecs_entity_t eVar1;
  ecs_entity_t eVar2;
  char *local_118;
  char *local_110;
  undefined8 local_108;
  char *local_100;
  char *local_f8;
  undefined8 local_f0;
  char *local_e8;
  char *local_e0;
  undefined8 local_d8;
  char *local_d0;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  char *local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  EcsComponentLifecycle local_58;
  
  eVar1 = ecs_new_module(world,0,"FlecsSystem",4,4);
  ecs_get_mut_w_entity(world,eVar1,eVar1,(_Bool *)0x0);
  ecs_set_name_prefix(world,"Ecs");
  ecs_new_component(world,2,"EcsComponentLifecycle",0x28,8);
  ecs_new_component(world,4,"EcsTrigger",0x28,8);
  ecs_new_component(world,5,"EcsSystem",0x50,8);
  ecs_new_component(world,7,"EcsTickSource",8,4);
  ecs_new_component(world,8,"EcsSignatureExpr",8,8);
  ecs_new_component(world,9,"EcsSignature",0x18,8);
  ecs_new_component(world,10,"EcsQuery",8,8);
  ecs_new_component(world,0xb,"EcsIterAction",8,8);
  ecs_new_component(world,0xc,"EcsContext",8,8);
  local_70 = "OnAdd";
  local_68 = "EcsOnAdd";
  local_60 = 0;
  ecs_set_ptr_w_entity(world,0x109,6,0x18,&local_70);
  eVar1 = ecs_get_scope((ecs_world_t *)0x12dbe8);
  ecs_add_entity(world,0x109,eVar1 | 0xfd00000000000000);
  local_88 = "OnRemove";
  local_80 = "EcsOnRemove";
  local_78 = 0;
  ecs_set_ptr_w_entity(world,0x10a,6,0x18,&local_88);
  eVar1 = ecs_get_scope((ecs_world_t *)0x12dc42);
  ecs_add_entity(world,0x10a,eVar1 | 0xfd00000000000000);
  local_a0 = "OnSet";
  local_98 = "EcsOnSet";
  local_90 = 0;
  ecs_set_ptr_w_entity(world,0x10b,6,0x18,&local_a0);
  eVar1 = ecs_get_scope((ecs_world_t *)0x12dc8f);
  ecs_add_entity(world,0x10b,eVar1 | 0xfd00000000000000);
  local_b8 = "UnSet";
  local_b0 = "EcsUnSet";
  local_a8 = 0;
  ecs_set_ptr_w_entity(world,0x10c,6,0x18,&local_b8);
  eVar1 = ecs_get_scope((ecs_world_t *)0x12dcdc);
  ecs_add_entity(world,0x10c,eVar1 | 0xfd00000000000000);
  local_d0 = "DisabledIntern";
  local_c8 = "EcsDisabledIntern";
  local_c0 = 0;
  ecs_set_ptr_w_entity(world,0x104,6,0x18,&local_d0);
  eVar1 = ecs_get_scope((ecs_world_t *)0x12dd29);
  ecs_add_entity(world,0x104,eVar1 | 0xfd00000000000000);
  local_e8 = "Inactive";
  local_e0 = "EcsInactive";
  local_d8 = 0;
  ecs_set_ptr_w_entity(world,0x105,6,0x18,&local_e8);
  eVar1 = ecs_get_scope((ecs_world_t *)0x12dd76);
  ecs_add_entity(world,0x105,eVar1 | 0xfd00000000000000);
  eVar1 = ecs_set_scope(world,0x118);
  local_100 = "OnDemand";
  local_f8 = "EcsOnDemand";
  local_f0 = 0;
  ecs_set_ptr_w_entity(world,0x106,6,0x18,&local_100);
  eVar2 = ecs_get_scope((ecs_world_t *)0x12ddd3);
  ecs_add_entity(world,0x106,eVar2 | 0xfd00000000000000);
  local_118 = "Monitor";
  local_110 = "EcsMonitor";
  local_108 = 0;
  ecs_set_ptr_w_entity(world,0x107,6,0x18,&local_118);
  eVar2 = ecs_get_scope((ecs_world_t *)0x12de1e);
  ecs_add_entity(world,0x107,eVar2 | 0xfd00000000000000);
  ecs_set_scope(world,eVar1);
  __FLECS__TEcsComponentLifecycle_value.array[0] = 2;
  __FLECS__TEcsTrigger_value.array[0] = 4;
  __FLECS__TEcsSystem_value.array[0] = 5;
  __FLECS__TEcsTickSource_value.array[0] = 7;
  __FLECS__TEcsSignatureExpr_value.array[0] = 8;
  __FLECS__TEcsSignature_value.array[0] = 9;
  __FLECS__TEcsQuery_value.array[0] = 10;
  __FLECS__TEcsIterAction_value.array[0] = 0xb;
  __FLECS__TEcsContext_value.array[0] = 0xc;
  local_58.ctor = sys_ctor_init_zero;
  local_58.dtor = ecs_colsystem_dtor;
  local_58.copy = (ecs_copy_t)0x0;
  local_58.move = (ecs_move_t)0x0;
  local_58.ctx = (void *)0x0;
  ecs_set_component_actions_w_entity(world,5,&local_58);
  bootstrap_set_system(world,"CreateSignature","SignatureExpr",CreateSignature);
  bootstrap_set_system(world,"CreateQuery","Signature, IterAction",CreateQuery);
  bootstrap_set_system(world,"CreateSystem","Query, IterAction, ?Context",CreateSystem);
  ecs_new_system(world,0,"OnSetComponentLifecycle",0x10b,"ComponentLifecycle, SYSTEM:Hidden",
                 OnSetComponentLifecycle);
  ecs_new_system(world,0,"OnSetTrigger",0x10b,"Trigger, SYSTEM:Hidden",OnSetTrigger);
  ecs_new_system(world,0,"OnSetTriggerCtx",0x10b,"Trigger, Context, SYSTEM:Hidden",OnSetTriggerCtx);
  ecs_new_system(world,0,"DisableSystem",0x107,"System, Disabled || DisabledIntern, SYSTEM:Hidden",
                 DisableSystem);
  ecs_new_system(world,0,"EnableSystem",0x107,"System, !Disabled, !DisabledIntern, SYSTEM:Hidden",
                 EnableSystem);
  return;
}

Assistant:

void FlecsSystemImport(
    ecs_world_t *world)
{
    ECS_MODULE(world, FlecsSystem);

    ecs_set_name_prefix(world, "Ecs");

    ecs_bootstrap_component(world, EcsComponentLifecycle);
    ecs_bootstrap_component(world, EcsTrigger);
    ecs_bootstrap_component(world, EcsSystem);
    ecs_bootstrap_component(world, EcsTickSource);
    ecs_bootstrap_component(world, EcsSignatureExpr);
    ecs_bootstrap_component(world, EcsSignature);
    ecs_bootstrap_component(world, EcsQuery);
    ecs_bootstrap_component(world, EcsIterAction);
    ecs_bootstrap_component(world, EcsContext);

    ecs_bootstrap_tag(world, EcsOnAdd);
    ecs_bootstrap_tag(world, EcsOnRemove);
    ecs_bootstrap_tag(world, EcsOnSet);
    ecs_bootstrap_tag(world, EcsUnSet);

    ecs_bootstrap_tag(world, EcsDisabledIntern);
    ecs_bootstrap_tag(world, EcsInactive);

    /* Put EcsOnDemand and EcsMonitor in flecs.core so they can be looked up
     * without using the flecs.systems prefix */
    ecs_entity_t old_scope = ecs_set_scope(world, EcsFlecsCore);
    ecs_bootstrap_tag(world, EcsOnDemand);
    ecs_bootstrap_tag(world, EcsMonitor);
    ecs_set_scope(world, old_scope);

    ECS_TYPE_IMPL(EcsComponentLifecycle);
    ECS_TYPE_IMPL(EcsTrigger);
    ECS_TYPE_IMPL(EcsSystem);
    ECS_TYPE_IMPL(EcsTickSource);
    ECS_TYPE_IMPL(EcsSignatureExpr);
    ECS_TYPE_IMPL(EcsSignature);
    ECS_TYPE_IMPL(EcsQuery);
    ECS_TYPE_IMPL(EcsIterAction);
    ECS_TYPE_IMPL(EcsContext);

    /* Bootstrap ctor and dtor for EcsSystem */
    ecs_set_component_actions_w_entity(world, ecs_typeid(EcsSystem), 
        &(EcsComponentLifecycle) {
            .ctor = sys_ctor_init_zero,
            .dtor = ecs_colsystem_dtor
        });

    /* Create systems necessary to create systems */
    bootstrap_set_system(world, "CreateSignature", "SignatureExpr", CreateSignature);
    bootstrap_set_system(world, "CreateQuery", "Signature, IterAction", CreateQuery);
    bootstrap_set_system(world, "CreateSystem", "Query, IterAction, ?Context", CreateSystem);

    /* From here we can create systems */

    /* Register OnSet system for EcsComponentLifecycle */
    ECS_SYSTEM(world, OnSetComponentLifecycle, EcsOnSet, ComponentLifecycle, SYSTEM:Hidden);

    /* Register OnSet system for triggers */
    ECS_SYSTEM(world, OnSetTrigger, EcsOnSet, Trigger, SYSTEM:Hidden);

    /* System that sets ctx for a trigger */
    ECS_SYSTEM(world, OnSetTriggerCtx, EcsOnSet, Trigger, Context, SYSTEM:Hidden);

    /* Monitors that trigger when a system is enabled or disabled */
    ECS_SYSTEM(world, DisableSystem, EcsMonitor, System, Disabled || DisabledIntern, SYSTEM:Hidden);
    ECS_SYSTEM(world, EnableSystem, EcsMonitor, System, !Disabled, !DisabledIntern, SYSTEM:Hidden);
}